

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_states.cpp
# Opt level: O1

void __thiscall
SMC::sample_distance
          (SMC *this,Atom *b,Atom *c,Atom *B,double theta,double lcd,Atom *p,double lcon,int label,
          int rem)

{
  long lVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  Atom *A;
  long lVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  Atom p2;
  Atom p1;
  double pdf [32];
  double cdf [32];
  double local_420;
  double local_418;
  double local_408;
  double local_3f8;
  double local_378;
  Point local_2f0;
  Atom local_2d8;
  Atom local_288;
  double local_238 [31];
  double local_140 [34];
  
  dVar19 = (b->super_Point).x - (c->super_Point).x;
  dVar30 = (b->super_Point).y - (c->super_Point).y;
  dVar16 = (b->super_Point).z - (c->super_Point).z;
  dVar30 = dVar16 * dVar16 + dVar19 * dVar19 + dVar30 * dVar30;
  if (dVar30 < 0.0) {
    dVar30 = sqrt(dVar30);
  }
  else {
    dVar30 = SQRT(dVar30);
  }
  dVar16 = (c->super_Point).x;
  dVar19 = (c->super_Point).y;
  dVar2 = (b->super_Point).x;
  dVar17 = (b->super_Point).y;
  dVar3 = (c->super_Point).z;
  dVar27 = (b->super_Point).z;
  dVar28 = cos(theta);
  dVar30 = (dVar28 * lcd) / dVar30;
  dVar28 = (c->super_Point).x;
  dVar24 = (c->super_Point).y;
  dVar23 = dVar28 - (dVar16 - dVar2) * dVar30;
  dVar26 = dVar24 - (dVar19 - dVar17) * dVar30;
  dVar16 = (c->super_Point).z;
  dVar27 = dVar16 - dVar30 * (dVar3 - dVar27);
  dVar28 = dVar28 - (b->super_Point).x;
  dVar24 = dVar24 - (b->super_Point).y;
  dVar16 = dVar16 - (b->super_Point).z;
  dVar30 = (B->super_Point).x;
  dVar19 = (B->super_Point).y;
  dVar2 = (B->super_Point).z;
  dVar17 = ((dVar2 - dVar27) * dVar16 + (dVar30 - dVar23) * dVar28 + (dVar19 - dVar26) * dVar24) /
           (dVar16 * dVar16 + dVar28 * dVar28 + dVar24 * dVar24);
  dVar3 = (dVar30 - dVar28 * dVar17) - dVar23;
  dVar28 = (dVar19 - dVar24 * dVar17) - dVar26;
  dVar2 = (dVar2 - dVar17 * dVar16) - dVar27;
  dVar30 = sin(theta);
  dVar17 = dVar2 * dVar2 + dVar3 * dVar3 + dVar28 * dVar28;
  dVar16 = SQRT(dVar17);
  dVar19 = dVar16;
  if (dVar17 < 0.0) {
    dVar19 = sqrt(dVar17);
  }
  dVar19 = (dVar30 * lcd) / dVar19;
  dVar30 = sin(theta);
  if (dVar17 < 0.0) {
    dVar16 = sqrt(dVar17);
  }
  dVar16 = (dVar30 * lcd) / dVar16;
  dVar24 = (dVar23 - dVar16 * dVar3) - (B->super_Point).x;
  dVar18 = (dVar26 - dVar16 * dVar28) - (B->super_Point).y;
  dVar30 = (dVar27 - dVar16 * dVar2) - (B->super_Point).z;
  dVar30 = dVar30 * dVar30 + dVar24 * dVar24 + dVar18 * dVar18;
  if (dVar30 < 0.0) {
    dVar30 = sqrt(dVar30);
  }
  else {
    dVar30 = SQRT(dVar30);
  }
  dVar24 = (dVar19 * dVar3 + dVar23) - (B->super_Point).x;
  dVar18 = (dVar19 * dVar28 + dVar26) - (B->super_Point).y;
  dVar16 = (dVar19 * dVar2 + dVar27) - (B->super_Point).z;
  dVar16 = dVar16 * dVar16 + dVar24 * dVar24 + dVar18 * dVar18;
  if (dVar16 < 0.0) {
    dVar16 = sqrt(dVar16);
  }
  else {
    dVar16 = SQRT(dVar16);
  }
  Atom::Atom(&local_288,0.0,0.0,0.0,-0x3039);
  Atom::Atom(&local_2d8,0.0,0.0,0.0,-0x3039);
  dVar30 = lcon - dVar30;
  dVar16 = lcon - dVar16;
  lVar6 = (long)rem;
  dVar22 = lcon - this->minDistcon[label][lVar6];
  dVar19 = this->minDistdel[label][lVar6];
  dVar18 = this->DistconBy[label][lVar6];
  dVar25 = dVar22 / dVar18 + 1e-05;
  dVar24 = this->DistdelBy[label][lVar6];
  dVar20 = (double)(int)dVar25 * dVar18;
  dVar4 = dVar18 + dVar20;
  local_420 = dVar30 - dVar19;
  iVar12 = (int)((1.0 / dVar24) * (dVar16 - dVar19));
  lVar7 = (long)(int)dVar25;
  if (local_420 <= 0.0) {
    local_238[0] = (1.0 / dVar18) *
                   ((dVar4 - dVar22) * this->etedCon[label][lVar6][lVar7][0] +
                   (dVar22 - dVar20) * this->etedCon[label][lVar6][lVar7 + 1][0]);
    local_420 = 0.0;
    iVar10 = 0;
  }
  else {
    dVar25 = (1.0 / dVar24) * local_420;
    iVar10 = (int)dVar25;
    dVar29 = ((double)(iVar10 + 1) * dVar24 - dVar30) + dVar19;
    local_420 = local_420 - (double)(int)dVar25 * dVar24;
    local_238[iVar10] =
         ((dVar22 - dVar20) * this->etedCon[label][lVar6][lVar7 + 1][(long)iVar10 + 1] * local_420 +
         (dVar4 - dVar22) * this->etedCon[label][lVar6][lVar7][(long)iVar10 + 1] * local_420 +
         dVar29 * this->etedCon[label][lVar6][lVar7][iVar10] * (dVar4 - dVar22) +
         this->etedCon[label][lVar6][lVar7 + 1][iVar10] * (dVar22 - dVar20) * dVar29) /
         (dVar18 * dVar24);
    local_420 = dVar24 - local_420;
  }
  if (iVar12 < 0x1f) {
    iVar9 = iVar12 + 1;
    dVar29 = ((double)iVar9 * dVar24 - dVar16) + dVar19;
    dVar25 = (dVar16 - dVar19) - (double)iVar12 * dVar24;
    local_238[iVar9] =
         ((dVar22 - dVar20) * this->etedCon[label][lVar6][lVar7 + 1][iVar9] * dVar25 +
         (dVar4 - dVar22) * this->etedCon[label][lVar6][lVar7][iVar9] * dVar25 +
         dVar29 * this->etedCon[label][lVar6][lVar7][iVar12] * (dVar4 - dVar22) +
         this->etedCon[label][lVar6][lVar7 + 1][iVar12] * (dVar22 - dVar20) * dVar29) /
         (dVar18 * dVar24);
    dVar16 = dVar24 - (((double)iVar9 * dVar24 + dVar19) - dVar16);
  }
  else {
    local_140[0] = (1.0 / dVar18) *
                   ((dVar4 - dVar22) * this->etedCon[label][lVar6][lVar7][0x1f] +
                   (dVar22 - dVar20) * this->etedCon[label][lVar6][lVar7 + 1][0x1f]);
    dVar16 = 0.0;
    iVar9 = 0x1f;
  }
  dVar29 = 1.0 / dVar18;
  dVar21 = (this->etedCon[label][lVar6][lVar7][(long)iVar10 + 1] * (dVar4 - dVar22) +
           this->etedCon[label][lVar6][lVar7 + 1][(long)iVar10 + 1] * (dVar22 - dVar20)) * dVar29;
  local_238[(long)iVar10 + 1] = dVar21;
  dVar25 = local_238[iVar10];
  local_140[(long)iVar10 + 1] = 0.0;
  local_140[(long)iVar10 + 2] = (dVar21 + dVar25) * 0.5 * local_420;
  iVar12 = iVar10 + 2;
  lVar13 = (long)iVar9;
  if (iVar12 < iVar9) {
    lVar11 = (long)iVar12;
    dVar18 = local_140[lVar11];
    lVar8 = 0;
    dVar25 = local_238[lVar11 + -1];
    do {
      dVar21 = (this->etedCon[label][lVar6][lVar7][lVar11 + lVar8] * (dVar4 - dVar22) +
               this->etedCon[label][lVar6][lVar7 + 1][lVar11 + lVar8] * (dVar22 - dVar20)) * dVar29;
      local_238[lVar11 + lVar8] = dVar21;
      dVar18 = dVar18 + (dVar25 + dVar21) * 0.5 * dVar24;
      local_140[lVar11 + lVar8 + 1] = dVar18;
      lVar1 = lVar11 + lVar8;
      lVar8 = lVar8 + 1;
      dVar25 = dVar21;
    } while (lVar1 + 1 < lVar13);
  }
  dVar22 = local_140[lVar13];
  dVar4 = (local_238[lVar13] + local_238[lVar13 + -1]) * 0.5 * dVar16 + dVar22;
  local_140[lVar13 + 1] = dVar4;
  iVar5 = rand();
  dVar25 = (((double)iVar5 + 0.5) / 2147483647.0) * dVar4 + 0.0;
  if (dVar25 <= local_140[(long)iVar10 + 2]) {
    dVar18 = dVar30 + (local_420 * dVar25) / local_140[(long)iVar10 + 2];
  }
  else {
    if (iVar12 < iVar9) {
      lVar6 = (long)iVar12;
      lVar7 = (lVar6 << 0x20) + -0x100000000;
      do {
        if (dVar25 <= local_140[lVar6 + 1]) {
          dVar30 = *(double *)((long)local_140 + (lVar7 >> 0x1d) + 8);
          dVar18 = ((dVar25 - dVar30) * dVar24) / (local_140[lVar6 + 1] - dVar30) +
                   (((double)(int)lVar6 * dVar24 + dVar19) - dVar24);
          break;
        }
        lVar6 = lVar6 + 1;
        lVar7 = lVar7 + 0x100000000;
      } while (lVar6 < lVar13);
    }
    if ((dVar25 <= dVar4) && (dVar22 <= dVar25)) {
      dVar18 = (dVar16 * (dVar25 - dVar22)) / (dVar4 - dVar22) +
               dVar24 * (double)(iVar9 + -1) + dVar19;
    }
  }
  dVar30 = (B->super_Point).x - dVar23;
  dVar22 = (B->super_Point).y - dVar26;
  dVar25 = (B->super_Point).z - dVar27;
  dVar16 = sin(theta);
  dVar19 = sin(theta);
  local_418 = SQRT(dVar17);
  dVar24 = local_418;
  if (dVar17 < 0.0) {
    dVar24 = sqrt(dVar17);
  }
  dVar4 = sin(theta);
  dVar30 = acos(((lcd * lcd * dVar16 * dVar19 + dVar25 * dVar25 + dVar30 * dVar30 + dVar22 * dVar22)
                - (lcon - dVar18) * (lcon - dVar18)) / (dVar4 * (dVar24 + dVar24) * lcd));
  dVar16 = sin(theta);
  dVar19 = cos(dVar30);
  dVar24 = local_418;
  if (dVar17 < 0.0) {
    dVar24 = sqrt(dVar17);
  }
  dVar24 = (dVar16 * lcd * dVar19) / dVar24;
  dVar18 = (c->super_Point).x - (b->super_Point).x;
  dVar22 = (c->super_Point).y - (b->super_Point).y;
  dVar25 = (c->super_Point).z - (b->super_Point).z;
  dVar16 = sin(theta);
  dVar19 = sin(dVar30);
  if (dVar17 < 0.0) {
    local_418 = sqrt(dVar17);
  }
  dVar29 = (c->super_Point).x - (b->super_Point).x;
  dVar4 = (c->super_Point).y - (b->super_Point).y;
  dVar20 = (c->super_Point).z - (b->super_Point).z;
  dVar4 = dVar20 * dVar20 + dVar29 * dVar29 + dVar4 * dVar4;
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
  dVar16 = (dVar16 * lcd * dVar19) / (local_418 * dVar4);
  local_2f0.x = dVar3 * dVar24 + dVar23 + (dVar28 * dVar25 - dVar22 * dVar2) * dVar16;
  local_2f0.y = dVar28 * dVar24 + dVar26 + (dVar2 * dVar18 - dVar25 * dVar3) * dVar16;
  local_2f0.z = dVar24 * dVar2 + dVar27 + (dVar3 * dVar22 - dVar18 * dVar28) * dVar16;
  Atom::operator=(&local_288,&local_2f0);
  local_408 = -dVar2;
  local_378 = -dVar3;
  local_3f8 = -dVar28;
  dVar16 = sin(theta);
  dVar19 = cos(dVar30);
  dVar24 = SQRT(dVar17);
  dVar18 = dVar24;
  if (dVar17 < 0.0) {
    dVar18 = sqrt(dVar17);
  }
  dVar18 = (dVar16 * lcd * dVar19) / dVar18;
  dVar22 = (c->super_Point).x - (b->super_Point).x;
  dVar19 = (c->super_Point).y - (b->super_Point).y;
  dVar25 = (c->super_Point).z - (b->super_Point).z;
  dVar16 = sin(theta);
  dVar30 = sin(dVar30);
  if (dVar17 < 0.0) {
    dVar24 = sqrt(dVar17);
  }
  dVar20 = (c->super_Point).x - (b->super_Point).x;
  dVar17 = (c->super_Point).y - (b->super_Point).y;
  dVar4 = (c->super_Point).z - (b->super_Point).z;
  dVar17 = dVar4 * dVar4 + dVar20 * dVar20 + dVar17 * dVar17;
  if (dVar17 < 0.0) {
    dVar17 = sqrt(dVar17);
  }
  else {
    dVar17 = SQRT(dVar17);
  }
  dVar30 = (dVar16 * lcd * dVar30) / (dVar24 * dVar17);
  local_2f0.x = (dVar23 + dVar3 * dVar18) - (dVar28 * dVar25 + local_408 * dVar19) * dVar30;
  local_2f0.y = (dVar26 + dVar28 * dVar18) - (dVar2 * dVar22 + dVar25 * local_378) * dVar30;
  local_2f0.z = (dVar27 + dVar18 * dVar2) - (dVar19 * dVar3 + dVar22 * local_3f8) * dVar30;
  Atom::operator=(&local_2d8,&local_2f0);
  iVar12 = rand();
  uVar14 = 0;
  uVar15 = 0x3fe00000;
  if (label == 0) {
    if (rem < 5) {
      uVar14 = 0xa3d70a4;
      uVar15 = 0x3fe0a3d7;
    }
    else {
      uVar14 = (undefined4)*(undefined8 *)(&DAT_0014f2e0 + (ulong)(rem < 9) * 8);
      uVar15 = (undefined4)((ulong)*(undefined8 *)(&DAT_0014f2e0 + (ulong)(rem < 9) * 8) >> 0x20);
    }
  }
  A = &local_288;
  if ((double)CONCAT44(uVar15,uVar14) < ((double)iVar12 + 0.5) / 2147483647.0) {
    A = &local_2d8;
  }
  Atom::operator=(p,A);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._name._M_dataplus._M_p != &local_2d8._name.field_2) {
    operator_delete(local_2d8._name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._name._M_dataplus._M_p != &local_288._name.field_2) {
    operator_delete(local_288._name._M_dataplus._M_p);
  }
  return;
}

Assistant:

void SMC::sample_distance(const Atom &b, const Atom &c, const Atom &B,
                          const double theta, const double lcd,
                          Atom &p, const double lcon,
                          const int label, const int rem) {
    // Find minimal, maximal distances of point B to bond angle circle
    double lbc = b.dis(c);
    Point e = c - (c - b) * (lcd * cos(theta) / lbc);
    Point Bp = B - (c - b) * ((B - e).dot(c - b) / (c - b).square());
    Point mm = e + (Bp - e) * (lcd * sin(theta) / Bp.dis(e));
    Point mp = e - (Bp - e) * (lcd * sin(theta) / Bp.dis(e));
    double md[2];
    int length = rem;

    md[0] = lcon - mp.dis(B);
    md[1] = lcon - mm.dis(B);
    Atom p1, p2;

    double x = lcon - minDistcon[label][length];
    double distby = DistconBy[label][length];
    double delby = DistdelBy[label][length];
    double mindeld = minDistdel[label][length];

    int conlower = int(x / distby + 0.00001);
    double x1 = conlower * distby;
    double x2 = x1 + distby;
    double d, y, lowgap, highgap = 0;

    int min_intY = int((md[0] - mindeld) * (1 / delby));    // integer lower bound of delta d
    int max_intY = int((md[1] - mindeld) * (1 / delby)) + 1;    // integer upper bound of delta d


    double denominator = distby * delby;
    double cdf[32];
    double pdf[32];

    if (md[0] - mindeld <= 0) {
        min_intY = 0;
        pdf[min_intY] =
                ((x2 - x) * etedCon[label][length][conlower][0] + (x - x1) * etedCon[label][length][conlower + 1][0]) *
                (1 / distby);
        lowgap = 0;
    }
    else {
        pdf[min_intY] =
                (etedCon[label][length][conlower][min_intY] * (x2 - x) * (delby * (min_intY + 1) - md[0] + mindeld) +
                 etedCon[label][length][conlower + 1][min_intY] * (x - x1) *
                 (delby * (min_intY + 1) - md[0] + mindeld) +
                 etedCon[label][length][conlower][min_intY + 1] * (x2 - x) * (md[0] - mindeld - delby * min_intY) +
                 etedCon[label][length][conlower + 1][min_intY + 1] * (x - x1) * (md[0] - mindeld - delby * min_intY)) /
                denominator;
        lowgap = delby - (md[0] - mindeld - delby * min_intY);
    }

    if (max_intY > 31) {
        max_intY = 31;
        pdf[max_intY] = ((x2 - x) * etedCon[label][length][conlower][31] +
                         (x - x1) * etedCon[label][length][conlower + 1][31]) * (1 / distby);
        highgap = 0;
    }
    else {
        pdf[max_intY] =
                (etedCon[label][length][conlower][max_intY - 1] * (x2 - x) * (delby * max_intY - md[1] + mindeld) +
                 etedCon[label][length][conlower + 1][max_intY - 1] * (x - x1) * (delby * max_intY - md[1] + mindeld) +
                 etedCon[label][length][conlower][max_intY] * (x2 - x) * (md[1] - mindeld - delby * (max_intY - 1)) +
                 etedCon[label][length][conlower + 1][max_intY] * (x - x1) *
                 (md[1] - mindeld - delby * (max_intY - 1))) / denominator;

        highgap = delby - (mindeld + delby * max_intY - md[1]);
    }


    int floor = min_intY + 1;
    pdf[floor] = ((x2 - x) * etedCon[label][length][conlower][floor] +
                  (x - x1) * etedCon[label][length][conlower + 1][floor]) * (1 / distby);
    cdf[min_intY] = 0;

    cdf[floor] = (pdf[floor] + pdf[min_intY]) * 0.5 * lowgap;


    for (int i = floor + 1; i < max_intY; i++) {
        pdf[i] = ((x2 - x) * etedCon[label][length][conlower][i] + (x - x1) * etedCon[label][length][conlower + 1][i]) *
                 (1 / distby);
        cdf[i] = cdf[i - 1] + (pdf[i] + pdf[i - 1]) * 0.5 * delby;
    }

    cdf[max_intY] = cdf[max_intY - 1] + (pdf[max_intY] + pdf[max_intY - 1]) * 0.5 * highgap;


    double randr = frand(0, cdf[max_intY]);

    double c1, c2 = 0;
    if (randr <= cdf[floor]) {
        c1 = randr;
        c2 = cdf[floor];
        y = md[0] + c1 * lowgap / c2;
    }
    else {
        for (int i = floor + 1; i < max_intY; i++) {
            if (randr <= cdf[i]) {
                c1 = randr - cdf[i - 1];
                c2 = cdf[i] - cdf[i - 1];
                y = mindeld + delby * i - delby + c1 * delby / c2;
                break;
            }
        }
        if (randr <= cdf[max_intY] && randr >= cdf[max_intY - 1]) {
            c1 = randr - cdf[max_intY - 1];
            c2 = cdf[max_intY] - cdf[max_intY - 1];
            y = mindeld + delby * (max_intY - 1) + c1 * highgap / c2;
        }
    }
    d = lcon - y;

    // Find points on bond angle circle corresponding to distances
    double gamma = acos(((B - e).square() + lcd * lcd * sin(theta) * sin(theta) - d * d) /
                        (2 * Bp.dis(e) * lcd * sin(theta)));
    p1 = e + (Bp - e) * (lcd * sin(theta) * cos(gamma) / Bp.dis(e)) +
         ((Bp - e).cross(c - b)) *
         (lcd * sin(theta) * sin(gamma) / (Bp.dis(e) * c.dis(b)));
    p2 = e + (Bp - e) * (lcd * sin(theta) * cos(gamma) / Bp.dis(e)) -
         ((Bp - e).cross(c - b)) *
         (lcd * sin(theta) * sin(gamma) / (Bp.dis(e) * c.dis(b)));

    double frand_chose = frand(0, 1);
    double threshold = 0.5;
    if (label == 0) {
        if (rem <= 4)
            threshold = 0.52;
        else if (rem > 4 && rem <= 8)
            threshold = 0.51;
        else
            threshold = 0.5;
    }
    if (frand_chose <= threshold)
        p = p1;
    else
        p = p2;
}